

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_redistribution.cpp
# Opt level: O3

void Redistribution::Apply
               (Box *bx,int ncomp,Array4<double> *dUdt_out,Array4<double> *dUdt_in,
               Array4<const_double> *U_in,Array4<double> *scratch,
               Array4<const_amrex::EBCellFlag> *flag,Array4<const_double> *apx,
               Array4<const_double> *apy,Array4<const_double> *apz,Array4<const_double> *vfrac,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,BCRec *d_bcrec_ptr,Geometry *lev_geom,Real dt,
               string redistribution_type,int srd_max_order,Real target_volfrac,
               Array4<const_double> *srd_update_scale)

{
  undefined1 auVar1 [12];
  undefined4 uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  ulong uVar20;
  long lVar21;
  double *pdVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  int iVar31;
  void *__s;
  long lVar32;
  int iVar33;
  int iVar34;
  double *pdVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  double *pdVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar53;
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  bool bVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  bool bVar61;
  int iVar62;
  double *local_6a0;
  double *local_698;
  double *local_690;
  double *local_680;
  double *local_640;
  double *local_630;
  double *local_5f8;
  Array4<int> local_578;
  Box result;
  Array4<double> local_4d8;
  FArrayBox nrs_fab;
  IArrayBox itracker;
  FArrayBox cent_hat_fab;
  FArrayBox nbhd_vol_fab;
  FArrayBox alpha_fab;
  Array4<const_double> local_330;
  Array4<double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<double> local_270;
  Array4<const_double> local_230;
  Array4<double> local_1f0;
  Array4<const_double> local_1b0;
  Array4<const_int> local_170;
  Elixir eli_chf;
  Elixir eli_nbf;
  Elixir eli_alpha;
  Elixir eli_nrs;
  Elixir eli_itr;
  Box result_1;
  Box result_2;
  Array4<const_int> local_70;
  long lVar50;
  
  if (0 < ncomp) {
    lVar8 = dUdt_out->kstride;
    lVar9 = dUdt_out->nstride;
    iVar19 = (bx->smallend).vect[2];
    iVar4 = (dUdt_out->begin).y;
    iVar5 = (dUdt_out->begin).x;
    iVar31 = (bx->bigend).vect[2];
    iVar6 = (bx->bigend).vect[0];
    iVar45 = (bx->bigend).vect[1];
    iVar23 = (bx->smallend).vect[1];
    iVar26 = (bx->smallend).vect[0];
    local_698 = (double *)(long)iVar26;
    lVar44 = dUdt_out->jstride * 8;
    pdVar22 = dUdt_out->p;
    iVar28 = (dUdt_out->begin).z;
    uVar20 = 0;
    do {
      iVar36 = iVar19 - iVar28;
      iVar33 = iVar19;
      if (iVar19 <= iVar31) {
        do {
          if (iVar23 <= iVar45) {
            __s = (void *)((long)pdVar22 +
                          (iVar36 * lVar8 + (long)local_698) * 8 +
                          ((long)iVar23 - (long)iVar4) * lVar44 + (long)iVar5 * -8);
            iVar27 = (iVar45 - iVar23) + 1;
            do {
              if (iVar26 <= iVar6) {
                memset(__s,0,(ulong)(uint)(iVar6 - iVar26) * 8 + 8);
              }
              __s = (void *)((long)__s + lVar44);
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          bVar47 = iVar33 != iVar31;
          iVar36 = iVar36 + 1;
          iVar33 = iVar33 + 1;
        } while (bVar47);
      }
      uVar20 = uVar20 + 1;
      local_698 = (double *)((long)local_698 + lVar9);
    } while (uVar20 != (uint)ncomp);
  }
  iVar19 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
  if (iVar19 == 0) {
    itracker.super_BaseFab<int>._vptr_BaseFab = (_func_int **)dUdt_in->p;
    itracker.super_BaseFab<int>.super_DataAllocator.m_arena = (Arena *)dUdt_in->jstride;
    itracker.super_BaseFab<int>.dptr = (int *)dUdt_in->kstride;
    itracker.super_BaseFab<int>.domain.smallend.vect._0_8_ = dUdt_in->nstride;
    itracker.super_BaseFab<int>.domain.bigend.vect[1] = (dUdt_in->begin).z;
    itracker.super_BaseFab<int>.domain.smallend.vect[2] = (dUdt_in->begin).x;
    itracker.super_BaseFab<int>.domain.bigend.vect[0] = (dUdt_in->begin).y;
    itracker.super_BaseFab<int>.domain.bigend.vect[2] = (dUdt_in->end).x;
    itracker.super_BaseFab<int>.domain.btype.itype = (dUdt_in->end).y;
    itracker.super_BaseFab<int>.nvar = (dUdt_in->end).z;
    itracker.super_BaseFab<int>.truesize._0_4_ = dUdt_in->ncomp;
    nrs_fab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)scratch->p;
    nrs_fab.super_BaseFab<double>.super_DataAllocator.m_arena = (Arena *)scratch->jstride;
    nrs_fab.super_BaseFab<double>.dptr = (double *)scratch->kstride;
    nrs_fab.super_BaseFab<double>.domain.smallend.vect._0_8_ = scratch->nstride;
    nrs_fab.super_BaseFab<double>.domain.bigend.vect[1] = (scratch->begin).z;
    nrs_fab.super_BaseFab<double>.domain.smallend.vect[2] = (scratch->begin).x;
    nrs_fab.super_BaseFab<double>.domain.bigend.vect[0] = (scratch->begin).y;
    nrs_fab.super_BaseFab<double>.domain.bigend.vect[2] = (scratch->end).x;
    nrs_fab.super_BaseFab<double>.domain.btype.itype = (scratch->end).y;
    nrs_fab.super_BaseFab<double>.nvar = (scratch->end).z;
    nrs_fab.super_BaseFab<double>.truesize._0_4_ = scratch->ncomp;
    amrex::apply_flux_redistribution
              (bx,dUdt_out,(Array4<const_double> *)&itracker,(Array4<const_double> *)&nrs_fab,0,
               ncomp,flag,vfrac,lev_geom);
  }
  else {
    iVar19 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
    if (iVar19 == 0) {
      iVar31 = (bx->smallend).vect[0];
      iVar19 = (bx->smallend).vect[1];
      iVar4 = (bx->smallend).vect[2];
      iVar6 = (bx->bigend).vect[0];
      iVar45 = (bx->bigend).vect[1];
      iVar5 = (bx->bigend).vect[2];
      uVar14 = *(undefined8 *)(bx->smallend).vect;
      uVar15 = *(undefined8 *)((bx->smallend).vect + 2);
      uVar16 = *(undefined8 *)((bx->bigend).vect + 2);
      result.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      result.bigend.vect[2] = (int)uVar16;
      result.btype.itype = (uint)((ulong)uVar16 >> 0x20);
      result.smallend.vect[2] = (int)uVar15;
      result.bigend.vect[0] = (int)((ulong)uVar15 >> 0x20);
      result.smallend.vect[0] = (int)uVar14;
      result.smallend.vect[1] = (int)((ulong)uVar14 >> 0x20);
      result.smallend.vect[2] = result.smallend.vect[2] + -2;
      result.bigend.vect[0] = result.bigend.vect[0] + 2;
      result.smallend.vect[1] = result.smallend.vect[1] + -2;
      result.smallend.vect[0] = result.smallend.vect[0] + -2;
      result.bigend.vect[1] = result.bigend.vect[1] + 2;
      result.bigend.vect[2] = result.bigend.vect[2] + 2;
      uVar14 = *(undefined8 *)(bx->smallend).vect;
      uVar15 = *(undefined8 *)((bx->smallend).vect + 2);
      uVar16 = *(undefined8 *)((bx->bigend).vect + 2);
      result_1.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      result_1.bigend.vect[2] = (int)uVar16;
      result_1.btype.itype = (uint)((ulong)uVar16 >> 0x20);
      result_1.smallend.vect[2] = (int)uVar15;
      result_1.bigend.vect[0] = (int)((ulong)uVar15 >> 0x20);
      result_1.smallend.vect[0] = (int)uVar14;
      result_1.smallend.vect[1] = (int)((ulong)uVar14 >> 0x20);
      result_1.smallend.vect[2] = result_1.smallend.vect[2] + -3;
      result_1.bigend.vect[0] = result_1.bigend.vect[0] + 3;
      result_1.smallend.vect[1] = result_1.smallend.vect[1] + -3;
      result_1.smallend.vect[0] = result_1.smallend.vect[0] + -3;
      result_1.bigend.vect[1] = result_1.bigend.vect[1] + 3;
      result_1.bigend.vect[2] = result_1.bigend.vect[2] + 3;
      uVar14 = *(undefined8 *)(bx->smallend).vect;
      uVar15 = *(undefined8 *)((bx->smallend).vect + 2);
      auVar1 = *(undefined1 (*) [12])&bx->bigend;
      uVar2 = bx->btype;
      result_2.smallend.vect[2] = (int)uVar15;
      result_2.bigend.vect[0] = (int)((ulong)uVar15 >> 0x20);
      result_2.smallend.vect[0] = (int)uVar14;
      result_2.smallend.vect[1] = (int)((ulong)uVar14 >> 0x20);
      result_2.smallend.vect[2] = result_2.smallend.vect[2] + -4;
      result_2.bigend.vect[0] = result_2.bigend.vect[0] + 4;
      result_2.smallend.vect[1] = result_2.smallend.vect[1] + -4;
      result_2.smallend.vect[0] = result_2.smallend.vect[0] + -4;
      result_2.bigend.vect[1] = auVar1._4_4_ + 4;
      result_2.bigend.vect[2] = auVar1._8_4_ + 4;
      result_2.btype.itype = uVar2;
      amrex::IArrayBox::IArrayBox(&itracker,&result_2,8,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&nrs_fab,&result_1,1,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&alpha_fab,&result_1,2,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&nbhd_vol_fab,&result,1,true,false,(Arena *)0x0);
      amrex::FArrayBox::FArrayBox(&cent_hat_fab,&result_1,3,true,false,(Arena *)0x0);
      if (itracker.super_BaseFab<int>.super_DataAllocator.m_arena == (Arena *)0x0) {
        itracker.super_BaseFab<int>.super_DataAllocator.m_arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir
                (&eli_itr,(void *)0x0,itracker.super_BaseFab<int>.super_DataAllocator.m_arena);
      local_578.p = itracker.super_BaseFab<int>.dptr;
      local_578.jstride =
           ((long)itracker.super_BaseFab<int>.domain.bigend.vect[0] -
           (long)itracker.super_BaseFab<int>.domain.smallend.vect[0]) + 1;
      local_578.kstride =
           (((long)itracker.super_BaseFab<int>.domain.bigend.vect[1] + 1) -
           (long)itracker.super_BaseFab<int>.domain.smallend.vect[1]) * local_578.jstride;
      local_578.nstride =
           (((long)itracker.super_BaseFab<int>.domain.bigend.vect[2] + 1) -
           (long)itracker.super_BaseFab<int>.domain.smallend.vect[2]) * local_578.kstride;
      local_578.begin.x = itracker.super_BaseFab<int>.domain.smallend.vect[0];
      local_578.begin.y = itracker.super_BaseFab<int>.domain.smallend.vect[1];
      local_578.begin.z = itracker.super_BaseFab<int>.domain.smallend.vect[2];
      local_578.end._0_8_ =
           (long)itracker.super_BaseFab<int>.domain.bigend.vect[0] + 1U & 0xffffffff |
           (long)itracker.super_BaseFab<int>.domain.bigend.vect[1] + 1 << 0x20;
      local_578.end.z = (int)((long)itracker.super_BaseFab<int>.domain.bigend.vect[2] + 1);
      local_578.ncomp = itracker.super_BaseFab<int>.nvar;
      local_170.p = itracker.super_BaseFab<int>.dptr;
      local_170.begin.x = itracker.super_BaseFab<int>.domain.smallend.vect[0];
      local_170.begin.y = itracker.super_BaseFab<int>.domain.smallend.vect[1];
      local_170.begin.z = itracker.super_BaseFab<int>.domain.smallend.vect[2];
      local_170.ncomp = itracker.super_BaseFab<int>.nvar;
      local_170.jstride = local_578.jstride;
      local_170.kstride = local_578.kstride;
      local_170.nstride = local_578.nstride;
      local_170.end._0_8_ = local_578.end._0_8_;
      local_170.end.z = local_578.end.z;
      if (nrs_fab.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        nrs_fab.super_BaseFab<double>.super_DataAllocator.m_arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir
                (&eli_nrs,(void *)0x0,nrs_fab.super_BaseFab<double>.super_DataAllocator.m_arena);
      local_4d8.p = nrs_fab.super_BaseFab<double>.dptr;
      local_4d8.jstride =
           ((long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)nrs_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_4d8.kstride =
           (((long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
           (long)nrs_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_4d8.jstride;
      local_4d8.nstride =
           (((long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)nrs_fab.super_BaseFab<double>.domain.smallend.vect[2]) * local_4d8.kstride;
      local_4d8.begin.x = nrs_fab.super_BaseFab<double>.domain.smallend.vect[0];
      local_4d8.begin.y = nrs_fab.super_BaseFab<double>.domain.smallend.vect[1];
      local_4d8.begin.z = nrs_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_4d8.end._0_8_ =
           (long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           (long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
      local_4d8.end.z = (int)((long)nrs_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_4d8.ncomp = nrs_fab.super_BaseFab<double>.nvar;
      local_1b0.p = nrs_fab.super_BaseFab<double>.dptr;
      local_1b0.begin.x = nrs_fab.super_BaseFab<double>.domain.smallend.vect[0];
      local_1b0.begin.y = nrs_fab.super_BaseFab<double>.domain.smallend.vect[1];
      local_1b0.begin.z = nrs_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_1b0.ncomp = nrs_fab.super_BaseFab<double>.nvar;
      local_1b0.jstride = local_4d8.jstride;
      local_1b0.kstride = local_4d8.kstride;
      local_1b0.nstride = local_4d8.nstride;
      local_1b0.end._0_8_ = local_4d8.end._0_8_;
      local_1b0.end.z = local_4d8.end.z;
      if (alpha_fab.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        alpha_fab.super_BaseFab<double>.super_DataAllocator.m_arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir
                (&eli_alpha,(void *)0x0,alpha_fab.super_BaseFab<double>.super_DataAllocator.m_arena)
      ;
      local_1f0.p = alpha_fab.super_BaseFab<double>.dptr;
      local_230.jstride =
           ((long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)alpha_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_230.kstride =
           (((long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
           (long)alpha_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_230.jstride;
      local_230.nstride =
           (((long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)alpha_fab.super_BaseFab<double>.domain.smallend.vect[2]) * local_230.kstride;
      local_1f0.begin.z = alpha_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_230.end._0_8_ =
           (long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           (long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
      local_230.end.z = (int)((long)alpha_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_1f0.ncomp = alpha_fab.super_BaseFab<double>.nvar;
      local_230.p = alpha_fab.super_BaseFab<double>.dptr;
      local_230.begin.z = alpha_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_230.ncomp = alpha_fab.super_BaseFab<double>.nvar;
      local_1f0.jstride = local_230.jstride;
      local_1f0.kstride = local_230.kstride;
      local_1f0.nstride = local_230.nstride;
      local_1f0.end._0_8_ = local_230.end._0_8_;
      local_1f0.end.z = local_230.end.z;
      if (nbhd_vol_fab.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        nbhd_vol_fab.super_BaseFab<double>.super_DataAllocator.m_arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir
                (&eli_nbf,(void *)0x0,nbhd_vol_fab.super_BaseFab<double>.super_DataAllocator.m_arena
                );
      local_270.p = nbhd_vol_fab.super_BaseFab<double>.dptr;
      local_2b0.jstride =
           ((long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_2b0.kstride =
           (((long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_2b0.jstride;
      local_2b0.nstride =
           (((long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[2]) * local_2b0.kstride;
      local_270.begin.z = nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_2b0.end._0_8_ =
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           (long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
      local_2b0.end.z = (int)((long)nbhd_vol_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_270.ncomp = nbhd_vol_fab.super_BaseFab<double>.nvar;
      local_2b0.p = nbhd_vol_fab.super_BaseFab<double>.dptr;
      local_2b0.begin.z = nbhd_vol_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_2b0.ncomp = nbhd_vol_fab.super_BaseFab<double>.nvar;
      local_270.jstride = local_2b0.jstride;
      local_270.kstride = local_2b0.kstride;
      local_270.nstride = local_2b0.nstride;
      local_270.end._0_8_ = local_2b0.end._0_8_;
      local_270.end.z = local_2b0.end.z;
      if (cent_hat_fab.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        cent_hat_fab.super_BaseFab<double>.super_DataAllocator.m_arena = amrex::The_Arena();
      }
      iVar28 = iVar31 + -1;
      iVar19 = iVar19 + -1;
      iVar4 = iVar4 + -1;
      amrex::Gpu::Elixir::Elixir
                (&eli_chf,(void *)0x0,cent_hat_fab.super_BaseFab<double>.super_DataAllocator.m_arena
                );
      auVar18 = _DAT_00664280;
      auVar17 = _DAT_0065b9b0;
      local_2f0.p = cent_hat_fab.super_BaseFab<double>.dptr;
      local_330.jstride =
           ((long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[0] -
           (long)cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      local_330.kstride =
           (((long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
           (long)cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[1]) * local_330.jstride;
      local_330.nstride =
           (((long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
           (long)cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[2]) * local_330.kstride;
      local_2f0.begin.z = cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_330.end._0_8_ =
           (long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
           (long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
      local_330.end.z = (int)((long)cent_hat_fab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      local_2f0.ncomp = cent_hat_fab.super_BaseFab<double>.nvar;
      local_330.p = cent_hat_fab.super_BaseFab<double>.dptr;
      local_330.begin.z = cent_hat_fab.super_BaseFab<double>.domain.smallend.vect[2];
      local_330.ncomp = cent_hat_fab.super_BaseFab<double>.nvar;
      bVar3 = (lev_geom->super_CoordSys).field_0x51;
      iVar26 = (lev_geom->domain).smallend.vect[0] - (uint)bVar3;
      lVar21 = (long)(lev_geom->domain).bigend.vect[0] + (ulong)bVar3;
      uVar30 = (uint)(byte)(lev_geom->super_CoordSys).field_0x52;
      iVar33 = (lev_geom->domain).smallend.vect[1] - uVar30;
      iVar27 = uVar30 + (lev_geom->domain).bigend.vect[1];
      uVar30 = (uint)(byte)(lev_geom->super_CoordSys).field_0x53;
      iVar36 = (lev_geom->domain).smallend.vect[2] - uVar30;
      iVar23 = uVar30 + (lev_geom->domain).bigend.vect[2];
      local_698 = dUdt_in->p;
      lVar8 = dUdt_in->jstride;
      lVar9 = dUdt_in->kstride;
      lVar44 = dUdt_in->nstride;
      if (((((iVar28 < iVar26) || (iVar19 < iVar33)) || (iVar4 < iVar36)) ||
          (((int)lVar21 <= iVar6 || (iVar27 <= iVar45)))) || (iVar23 <= iVar5)) {
        iVar34 = (dUdt_in->begin).z;
        if (0 < ncomp) {
          iVar45 = iVar45 + 1;
          iVar5 = iVar5 + 1;
          iVar7 = (dUdt_in->begin).y;
          uVar30 = (iVar6 - iVar31) + 2;
          auVar60._0_8_ = (long)iVar28;
          auVar60._8_4_ = iVar28;
          auVar60._12_4_ = iVar28 >> 0x1f;
          auVar48._8_8_ = auVar60._8_8_ + 1;
          auVar48._0_8_ = auVar60._0_8_;
          auVar52._4_4_ = 0;
          auVar52._0_4_ = uVar30;
          auVar52._8_4_ = uVar30;
          auVar52._12_4_ = 0;
          auVar54._0_8_ = (long)iVar26;
          auVar54._8_4_ = iVar26;
          auVar54._12_4_ = iVar26 >> 0x1f;
          auVar55._8_4_ = (int)lVar21;
          auVar55._0_8_ = lVar21;
          auVar55._12_4_ = (int)((ulong)lVar21 >> 0x20);
          pdVar22 = local_698 + (1 - (long)(dUdt_in->begin).x);
          uVar20 = 0;
          auVar52 = auVar52 ^ _DAT_0065b9b0;
          auVar54 = auVar54 ^ _DAT_00664280;
          auVar55 = auVar55 ^ _DAT_00664280;
          do {
            iVar31 = iVar4;
            if (iVar4 <= iVar5) {
              do {
                if (iVar19 <= iVar45) {
                  iVar26 = iVar19;
                  do {
                    if (iVar28 <= iVar6 + 1) {
                      lVar21 = ((long)iVar26 - (long)iVar7) * lVar8 +
                               ((long)iVar31 - (long)iVar34) * lVar9 + (long)iVar28;
                      uVar41 = 0;
                      auVar49 = auVar48;
                      do {
                        bVar47 = false;
                        iVar57 = SUB164(auVar49 ^ auVar18,0);
                        iVar58 = SUB164(auVar49 ^ auVar18,4);
                        if (iVar36 <= iVar31) {
                          iVar53 = auVar55._4_4_;
                          bVar47 = iVar58 <= iVar53 && (iVar58 != iVar53 || iVar57 <= auVar55._0_4_)
                          ;
                        }
                        auVar59._8_4_ = (int)uVar41;
                        auVar59._0_8_ = uVar41;
                        auVar59._12_4_ = (int)(uVar41 >> 0x20);
                        auVar60 = (auVar59 | _DAT_0065b9a0) ^ auVar17;
                        iVar53 = auVar52._4_4_;
                        iVar62 = auVar60._4_4_;
                        bVar61 = iVar53 < iVar62 ||
                                 iVar62 == iVar53 && auVar52._0_4_ < auVar60._0_4_;
                        iVar53 = auVar54._4_4_;
                        bVar56 = (iVar58 < iVar53 || iVar26 < iVar33) ||
                                 iVar58 == iVar53 && iVar57 < auVar54._0_4_;
                        if ((bool)(~bVar61 & bVar56 |
                                  ((bVar61 || bVar56) | bVar47 & iVar26 <= iVar27 & iVar31 <= iVar23
                                  ) ^ 1U)) {
                          pdVar22[lVar21 + (uVar41 - 1)] = 0.0;
                          pdVar22[lVar21 + uVar41] = 0.0;
                        }
                        uVar41 = uVar41 + 2;
                        lVar50 = auVar49._8_8_;
                        auVar49._0_8_ = auVar49._0_8_ + 2;
                        auVar49._8_8_ = lVar50 + 2;
                      } while (((ulong)uVar30 + 2 & 0xfffffffffffffffe) != uVar41);
                    }
                    bVar47 = iVar26 != iVar45;
                    iVar26 = iVar26 + 1;
                  } while (bVar47);
                }
                bVar47 = iVar31 != iVar5;
                iVar31 = iVar31 + 1;
              } while (bVar47);
            }
            uVar20 = uVar20 + 1;
            pdVar22 = pdVar22 + lVar44;
          } while (uVar20 != (uint)ncomp);
        }
      }
      else {
        iVar34 = (dUdt_in->begin).z;
      }
      if (0 < ncomp) {
        iVar19 = (scratch->begin).z;
        iVar4 = (scratch->end).x;
        lVar21 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 8);
        lVar50 = scratch->jstride;
        lVar10 = scratch->kstride;
        lVar24 = scratch->nstride;
        lVar37 = U_in->jstride;
        iVar5 = (scratch->begin).y;
        lVar38 = (long)iVar5;
        iVar31 = (scratch->begin).x;
        lVar32 = (long)iVar31;
        local_698 = local_698 +
                    (((lVar38 - (dUdt_in->begin).y) * lVar8 + lVar32) - (long)(dUdt_in->begin).x);
        iVar6 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x24);
        lVar40 = U_in->nstride;
        iVar45 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x20);
        local_6a0 = U_in->p + (((lVar38 - (U_in->begin).y) * lVar37 + lVar32) -
                              (long)(U_in->begin).x);
        lVar11 = U_in->kstride;
        iVar23 = (U_in->begin).z;
        lVar12 = *(long *)redistribution_type.field_2._M_allocated_capacity;
        lVar13 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 0x10);
        iVar26 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x28);
        iVar28 = (scratch->end).z;
        iVar33 = (scratch->end).y;
        local_690 = scratch->p;
        uVar20 = 0;
        do {
          iVar36 = iVar19;
          if (iVar19 < iVar28) {
            do {
              if (iVar5 < iVar33) {
                lVar42 = (long)iVar36;
                pdVar22 = (double *)((lVar42 - iVar19) * lVar10 * 8 + (long)local_690);
                pdVar46 = (double *)((lVar42 - iVar34) * lVar9 * 8 + (long)local_698);
                pdVar35 = (double *)((lVar42 - iVar23) * lVar11 * 8 + (long)local_6a0);
                lVar43 = (lVar42 - iVar26) * lVar13 * 8 +
                         lVar32 * 8 + (lVar38 - iVar6) * lVar21 * 8 + (long)iVar45 * -8 + lVar12;
                lVar42 = lVar38;
                do {
                  if (iVar31 < iVar4) {
                    lVar25 = 0;
                    do {
                      dVar51 = 1.0;
                      if (lVar12 != 0) {
                        dVar51 = *(double *)(lVar43 + lVar25 * 8);
                      }
                      pdVar22[lVar25] = (pdVar46[lVar25] * dt) / dVar51 + pdVar35[lVar25];
                      lVar25 = lVar25 + 1;
                    } while (iVar4 - iVar31 != (int)lVar25);
                  }
                  lVar42 = lVar42 + 1;
                  pdVar22 = pdVar22 + lVar50;
                  pdVar46 = pdVar46 + lVar8;
                  pdVar35 = pdVar35 + lVar37;
                  lVar43 = lVar43 + lVar21 * 8;
                } while (iVar33 != (int)lVar42);
              }
              bVar47 = iVar36 != iVar28 + -1;
              iVar36 = iVar36 + 1;
            } while (bVar47);
          }
          uVar20 = uVar20 + 1;
          local_690 = local_690 + lVar24;
          local_698 = local_698 + lVar44;
          local_6a0 = local_6a0 + lVar40;
        } while (uVar20 != (uint)ncomp);
      }
      local_2f0.jstride = local_330.jstride;
      local_2f0.kstride = local_330.kstride;
      local_2f0.nstride = local_330.nstride;
      local_2f0.end._0_8_ = local_330.end._0_8_;
      local_2f0.end.z = local_330.end.z;
      MakeITracker(bx,apx,apy,apz,vfrac,&local_578,lev_geom,target_volfrac);
      local_70.p = local_578.p;
      local_70.jstride = local_578.jstride;
      local_70.kstride = local_578.kstride;
      local_70.nstride = local_578.nstride;
      local_70.begin.x = local_578.begin.x;
      local_70.begin.y = local_578.begin.y;
      local_70.begin.z = local_578.begin.z;
      local_70.end.x = local_578.end.x;
      local_70.end.y = local_578.end.y;
      local_70.end.z = local_578.end.z;
      local_70.ncomp = local_578.ncomp;
      MakeStateRedistUtils
                (bx,flag,vfrac,ccc,&local_70,&local_4d8,&local_1f0,&local_270,&local_2f0,lev_geom,
                 target_volfrac);
      StateRedistribute(bx,ncomp,dUdt_out,scratch,flag,vfrac,fcx,fcy,fcz,ccc,d_bcrec_ptr,&local_170,
                        &local_1b0,&local_230,&local_2b0,&local_330,lev_geom,
                        (int)redistribution_type._M_string_length);
      if (0 < ncomp) {
        lVar8 = dUdt_out->jstride;
        lVar9 = U_in->jstride;
        iVar19 = (bx->smallend).vect[1];
        lVar32 = (long)iVar19;
        iVar4 = (bx->smallend).vect[0];
        lVar38 = (long)iVar4;
        iVar5 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x24);
        lVar44 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 8);
        iVar31 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x20);
        lVar21 = dUdt_in->jstride;
        lVar50 = *(long *)redistribution_type.field_2._M_allocated_capacity;
        lVar10 = *(long *)(redistribution_type.field_2._M_allocated_capacity + 0x10);
        iVar6 = *(int *)(redistribution_type.field_2._M_allocated_capacity + 0x28);
        local_630 = dUdt_out->p +
                    (((lVar32 - (dUdt_out->begin).y) * lVar8 + lVar38) - (long)(dUdt_out->begin).x);
        lVar24 = dUdt_out->kstride;
        lVar37 = dUdt_out->nstride;
        iVar45 = (dUdt_out->begin).z;
        local_680 = U_in->p + (((lVar32 - (U_in->begin).y) * lVar9 + lVar38) - (long)(U_in->begin).x
                              );
        lVar40 = U_in->kstride;
        lVar11 = U_in->nstride;
        iVar23 = (U_in->begin).z;
        local_640 = dUdt_in->p +
                    (((lVar32 - (dUdt_in->begin).y) * lVar21 + lVar38) - (long)(dUdt_in->begin).x);
        lVar12 = dUdt_in->kstride;
        lVar13 = dUdt_in->nstride;
        iVar26 = (dUdt_in->begin).z;
        iVar28 = (bx->smallend).vect[2];
        iVar33 = (bx->bigend).vect[2];
        iVar36 = (bx->bigend).vect[0];
        iVar27 = (bx->bigend).vect[1];
        uVar20 = 0;
        do {
          iVar34 = iVar28;
          if (iVar28 <= iVar33) {
            do {
              if (iVar19 <= iVar27) {
                lVar42 = (long)iVar34;
                pdVar35 = (double *)((lVar42 - iVar23) * lVar40 * 8 + (long)local_680);
                pdVar46 = (double *)((lVar42 - iVar45) * lVar24 * 8 + (long)local_630);
                lVar29 = (lVar42 - iVar6) * lVar10 * 8 +
                         lVar38 * 8 + (lVar32 - iVar5) * lVar44 * 8 + (long)iVar31 * -8 + lVar50;
                pdVar22 = (double *)((lVar42 - iVar26) * lVar12 * 8 + (long)local_640);
                lVar43 = (long)local_4d8.p +
                         (lVar42 - local_4d8.begin.z) * local_4d8.kstride * 8 +
                         lVar38 * 8 + (lVar32 - local_4d8.begin.y) * local_4d8.jstride * 8 +
                         (long)local_4d8.begin.x * -8;
                lVar25 = (long)local_578.p +
                         (lVar42 - local_578.begin.z) * local_578.kstride * 4 +
                         lVar38 * 4 + (lVar32 - local_578.begin.y) * local_578.jstride * 4 +
                         (long)local_578.begin.x * -4;
                lVar42 = lVar32;
                do {
                  if (iVar4 <= iVar36) {
                    lVar39 = 0;
                    do {
                      if ((0 < *(int *)(lVar25 + lVar39 * 4)) ||
                         (1.0 < *(double *)(lVar43 + lVar39 * 8))) {
                        dVar51 = 1.0;
                        if (lVar50 != 0) {
                          dVar51 = *(double *)(lVar29 + lVar39 * 8);
                        }
                        pdVar46[lVar39] = ((pdVar46[lVar39] - pdVar35[lVar39]) * dVar51) / dt;
                      }
                      else {
                        pdVar46[lVar39] = pdVar22[lVar39];
                      }
                      lVar39 = lVar39 + 1;
                    } while ((iVar36 - iVar4) + 1 != (int)lVar39);
                  }
                  lVar42 = lVar42 + 1;
                  pdVar35 = pdVar35 + lVar9;
                  pdVar46 = pdVar46 + lVar8;
                  lVar29 = lVar29 + lVar44 * 8;
                  pdVar22 = pdVar22 + lVar21;
                  lVar43 = lVar43 + local_4d8.jstride * 8;
                  lVar25 = lVar25 + local_578.jstride * 4;
                } while (iVar27 + 1 != (int)lVar42);
              }
              bVar47 = iVar34 != iVar33;
              iVar34 = iVar34 + 1;
            } while (bVar47);
          }
          uVar20 = uVar20 + 1;
          local_680 = local_680 + lVar11;
          local_630 = local_630 + lVar37;
          local_640 = local_640 + lVar13;
        } while (uVar20 != (uint)ncomp);
      }
      amrex::Gpu::Elixir::~Elixir(&eli_chf);
      amrex::Gpu::Elixir::~Elixir(&eli_nbf);
      amrex::Gpu::Elixir::~Elixir(&eli_alpha);
      amrex::Gpu::Elixir::~Elixir(&eli_nrs);
      amrex::Gpu::Elixir::~Elixir(&eli_itr);
      cent_hat_fab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
      amrex::BaseFab<double>::clear(&cent_hat_fab.super_BaseFab<double>);
      nbhd_vol_fab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
      amrex::BaseFab<double>::clear(&nbhd_vol_fab.super_BaseFab<double>);
      alpha_fab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
      amrex::BaseFab<double>::clear(&alpha_fab.super_BaseFab<double>);
      nrs_fab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
      amrex::BaseFab<double>::clear(&nrs_fab.super_BaseFab<double>);
      itracker.super_BaseFab<int>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712c98;
      amrex::BaseFab<int>::clear(&itracker.super_BaseFab<int>);
    }
    else {
      iVar19 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
      if (iVar19 != 0) {
        amrex::Error_host("Not a legit redist_type");
        return;
      }
      if (0 < ncomp) {
        lVar8 = dUdt_out->jstride;
        lVar9 = dUdt_out->kstride;
        lVar44 = dUdt_out->nstride;
        iVar19 = (dUdt_out->begin).z;
        lVar21 = dUdt_in->jstride;
        lVar50 = dUdt_in->kstride;
        iVar4 = (bx->smallend).vect[1];
        lVar24 = (long)iVar4;
        iVar5 = (bx->smallend).vect[0];
        local_5f8 = dUdt_out->p +
                    (((lVar24 - (dUdt_out->begin).y) * lVar8 + (long)iVar5) -
                    (long)(dUdt_out->begin).x);
        lVar10 = dUdt_in->nstride;
        iVar31 = (dUdt_in->begin).z;
        pdVar22 = dUdt_in->p +
                  (((lVar24 - (dUdt_in->begin).y) * lVar21 + (long)iVar5) - (long)(dUdt_in->begin).x
                  );
        iVar6 = (bx->smallend).vect[2];
        iVar45 = (bx->bigend).vect[2];
        iVar23 = (bx->bigend).vect[0];
        iVar26 = (bx->bigend).vect[1];
        uVar20 = 0;
        do {
          iVar28 = iVar6;
          if (iVar6 <= iVar45) {
            do {
              if (iVar4 <= iVar26) {
                pdVar46 = (double *)(((long)iVar28 - (long)iVar19) * lVar9 * 8 + (long)local_5f8);
                pdVar35 = (double *)(((long)iVar28 - (long)iVar31) * lVar50 * 8 + (long)pdVar22);
                lVar37 = lVar24;
                do {
                  if (iVar5 <= iVar23) {
                    lVar40 = 0;
                    do {
                      pdVar46[lVar40] = pdVar35[lVar40];
                      lVar40 = lVar40 + 1;
                    } while ((iVar23 - iVar5) + 1 != (int)lVar40);
                  }
                  lVar37 = lVar37 + 1;
                  pdVar46 = pdVar46 + lVar8;
                  pdVar35 = pdVar35 + lVar21;
                } while (iVar26 + 1 != (int)lVar37);
              }
              bVar47 = iVar28 != iVar45;
              iVar28 = iVar28 + 1;
            } while (bVar47);
          }
          uVar20 = uVar20 + 1;
          local_5f8 = local_5f8 + lVar44;
          pdVar22 = pdVar22 + lVar10;
        } while (uVar20 != (uint)ncomp);
      }
    }
  }
  return;
}

Assistant:

void Redistribution::Apply ( Box const& bx, int ncomp,
                             Array4<Real      > const& dUdt_out,
                             Array4<Real      > const& dUdt_in,
                             Array4<Real const> const& U_in,
                             Array4<Real> const& scratch,
                             Array4<EBCellFlag const> const& flag,
                             AMREX_D_DECL(Array4<Real const> const& apx,
                                          Array4<Real const> const& apy,
                                          Array4<Real const> const& apz),
                             Array4<amrex::Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             amrex::BCRec  const* d_bcrec_ptr,
                             Geometry const& lev_geom, Real dt,
                             std::string redistribution_type,
                             const int srd_max_order,
                             amrex::Real target_volfrac,
                             Array4<Real const> const& srd_update_scale)
{
    // redistribution_type = "NoRedist";       // no redistribution
    // redistribution_type = "FluxRedist"      // flux_redistribute
    // redistribution_type = "StateRedist";    // (weighted) state redistribute

    amrex::ParallelFor(bx,ncomp,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            dUdt_out(i,j,k,n) = 0.;
        });

    if (redistribution_type == "FluxRedist")
    {
        int icomp = 0;
        apply_flux_redistribution (bx, dUdt_out, dUdt_in, scratch, icomp, ncomp, flag, vfrac, lev_geom);

    } else if (redistribution_type == "StateRedist") {

        Box const& bxg1 = grow(bx,1);
        Box const& bxg2 = grow(bx,2);
        Box const& bxg3 = grow(bx,3);
        Box const& bxg4 = grow(bx,4);

#if (AMREX_SPACEDIM == 2)
        // We assume that in 2D a cell will only need at most 3 neighbors to merge with, and we
        //    use the first component of this for the number of neighbors
        IArrayBox itracker(bxg4,4);
        // How many nbhds is a cell in
#else
        // We assume that in 3D a cell will only need at most 7 neighbors to merge with, and we
        //    use the first component of this for the number of neighbors
        IArrayBox itracker(bxg4,8);
#endif
        FArrayBox nrs_fab(bxg3,1);
        FArrayBox alpha_fab(bxg3,2);

        // Total volume of all cells in my nbhd
        FArrayBox nbhd_vol_fab(bxg2,1);

        // Centroid of my nbhd
        FArrayBox cent_hat_fab     (bxg3,AMREX_SPACEDIM);

        Elixir eli_itr = itracker.elixir();
        Array4<int> itr = itracker.array();
        Array4<int const> itr_const = itracker.const_array();

        Elixir eli_nrs = nrs_fab.elixir();
        Array4<Real      > nrs       = nrs_fab.array();
        Array4<Real const> nrs_const = nrs_fab.const_array();

        Elixir eli_alpha = alpha_fab.elixir();
        Array4<Real      > alpha       = alpha_fab.array();
        Array4<Real const> alpha_const = alpha_fab.const_array();

        Elixir eli_nbf = nbhd_vol_fab.elixir();
        Array4<Real      > nbhd_vol       = nbhd_vol_fab.array();
        Array4<Real const> nbhd_vol_const = nbhd_vol_fab.const_array();

        Elixir eli_chf = cent_hat_fab.elixir();
        Array4<Real      > cent_hat       = cent_hat_fab.array();
        Array4<Real const> cent_hat_const = cent_hat_fab.const_array();

        Box domain_per_grown = lev_geom.Domain();
        AMREX_D_TERM(if (lev_geom.isPeriodic(0)) domain_per_grown.grow(0,1);,
                     if (lev_geom.isPeriodic(1)) domain_per_grown.grow(1,1);,
                     if (lev_geom.isPeriodic(2)) domain_per_grown.grow(2,1););

        // At any external Dirichlet domain boundaries we need to set dUdt_in to 0
        //    in the cells just outside the domain because those values will be used
        //    in the slope computation in state redistribution.  We assume here that
        //    the ext_dir values of U_in itself have already been set.
        if (!domain_per_grown.contains(bxg1))
            amrex::ParallelFor(bxg1,ncomp,
            [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                {
                    if (!domain_per_grown.contains(IntVect(AMREX_D_DECL(i,j,k))))
                        dUdt_in(i,j,k,n) = 0.;
                });

        amrex::ParallelFor(Box(scratch), ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                const Real scale = (srd_update_scale) ? srd_update_scale(i,j,k) : Real(1.0);
                scratch(i,j,k,n) = U_in(i,j,k,n) + dt * dUdt_in(i,j,k,n) / scale;
            }
        );

        MakeITracker(bx, AMREX_D_DECL(apx, apy, apz), vfrac, itr, lev_geom, target_volfrac);

        MakeStateRedistUtils(bx, flag, vfrac, ccc, itr, nrs, alpha, nbhd_vol, cent_hat,
                             lev_geom, target_volfrac);

        StateRedistribute(bx, ncomp, dUdt_out, scratch, flag, vfrac,
                          AMREX_D_DECL(fcx, fcy, fcz), ccc,  d_bcrec_ptr,
                          itr_const, nrs_const, alpha_const, nbhd_vol_const,
                          cent_hat_const, lev_geom, srd_max_order);

        amrex::ParallelFor(bx, ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                // Only update the values which actually changed -- this makes
                // the results insensitive to tiling -- otherwise cells that aren't
                // changed but are in a tile on which StateRedistribute gets called
                // will have precision-level changes due to adding/subtracting U_in
                // and multiplying/dividing by dt.   Here we test on whether (i,j,k)
                // has at least one neighbor and/or whether (i,j,k) is in the
                // neighborhood of another cell -- if either of those is true the
                // value may have changed

                if (itr(i,j,k,0) > 0 || nrs(i,j,k) > 1.)
                {
                   const Real scale = (srd_update_scale) ? srd_update_scale(i,j,k) : Real(1.0);

                   dUdt_out(i,j,k,n) = scale * (dUdt_out(i,j,k,n) - U_in(i,j,k,n)) / dt;

                }
                else
                {
                   dUdt_out(i,j,k,n) = dUdt_in(i,j,k,n);
                }
            }
        );

    } else if (redistribution_type == "NoRedist") {
        amrex::ParallelFor(bx, ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                dUdt_out(i,j,k,n) = dUdt_in(i,j,k,n);
            }
        );

    } else {
       amrex::Error("Not a legit redist_type");
    }
}